

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O0

CF2_F16Dot16 cf2_stack_popFixed(CF2_Stack stack)

{
  CF2_NumberType CVar1;
  CF2_Stack stack_local;
  
  if (stack->top == stack->buffer) {
    cf2_setError(stack->error,0xa1);
    stack_local._4_4_ = 0;
  }
  else {
    stack->top = stack->top + -1;
    CVar1 = stack->top->type;
    if (CVar1 == CF2_NumberFrac) {
      stack_local._4_4_ = (int)(((stack->top->u).r + 0x2000) - (uint)((stack->top->u).r < 0)) >> 0xe
      ;
    }
    else if (CVar1 == CF2_NumberInt) {
      stack_local._4_4_ = (stack->top->u).r << 0x10;
    }
    else {
      stack_local._4_4_ = (stack->top->u).r;
    }
  }
  return stack_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( CF2_Fixed )
  cf2_stack_popFixed( CF2_Stack  stack )
  {
    if ( stack->top == stack->buffer )
    {
      CF2_SET_ERROR( stack->error, Stack_Underflow );
      return cf2_intToFixed( 0 );    /* underflow */
    }

    stack->top--;

    switch ( stack->top->type )
    {
    case CF2_NumberInt:
      return cf2_intToFixed( stack->top->u.i );
    case CF2_NumberFrac:
      return cf2_fracToFixed( stack->top->u.f );
    default:
      return stack->top->u.r;
    }
  }